

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.h
# Opt level: O3

Vec_Int_t * Ga2_ObjLeaves(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *in_RAX;
  uint uVar5;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar5 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (-1 < (int)uVar5) {
    pVVar3 = p->vMapping;
    if ((int)uVar5 < pVVar3->nSize) {
      piVar4 = pVVar3->pArray;
      uVar1 = piVar4[uVar5 & 0x7fffffff];
      if ((-1 < (long)(int)uVar1) && (uVar1 < (uint)pVVar3->nSize)) {
        Ga2_ObjLeaves_v_0 = piVar4[(int)uVar1];
        if ((int)uVar5 < pVVar3->nSize) {
          if ((-2 < piVar4[uVar5 & 0x7fffffff]) &&
             (uVar5 = piVar4[uVar5 & 0x7fffffff] + 1, uVar5 < (uint)pVVar3->nSize)) {
            Ga2_ObjLeaves_v_1 = piVar4 + uVar5;
            return in_RAX;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline Vec_Int_t * Ga2_ObjLeaves( Gia_Man_t * p, Gia_Obj_t * pObj )          { static Vec_Int_t v; v.nSize = Ga2_ObjLeaveNum(p, pObj), v.pArray = Ga2_ObjLeavePtr(p, pObj); return &v;       }